

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor-transfer-function.h
# Opt level: O0

vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_> *
__thiscall
wasm::analysis::
VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
::transfer(VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
           *this,BasicBlock *bb,Element *inputState)

{
  bool bVar1;
  reference ppEVar2;
  vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
  *pvVar3;
  undefined1 local_30 [16];
  reverse_iterator cfgIter;
  Element *inputState_local;
  BasicBlock *bb_local;
  VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
  *this_local;
  
  this->currState = inputState;
  cfgIter.current._M_current =
       (__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        )(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          )inputState;
  BasicBlock::rbegin((BasicBlock *)(local_30 + 8));
  while( true ) {
    BasicBlock::rend((BasicBlock *)local_30);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
                             *)local_30);
    if (!bVar1) break;
    ppEVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
                           *)(local_30 + 8));
    Visitor<wasm::analysis::LivenessTransferFunction,_void>::visit
              ((Visitor<wasm::analysis::LivenessTransferFunction,_void> *)this,*ppEVar2);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
                  *)(local_30 + 8));
  }
  this->currState = (Element *)0x0;
  pvVar3 = BasicBlock::preds(bb);
  return pvVar3;
}

Assistant:

const std::vector<const BasicBlock*>&
  transfer(const BasicBlock& bb, typename L::Element& inputState) noexcept {
    // If the block is empty, we propagate the state by inputState =
    // outputState.

    currState = &inputState;
    if constexpr (Direction == AnalysisDirection::Backward) {
      for (auto cfgIter = bb.rbegin(); cfgIter != bb.rend(); ++cfgIter) {
        static_cast<SubType*>(this)->visit(*cfgIter);
      }
    } else {
      for (auto* inst : bb) {
        static_cast<SubType*>(this)->visit(inst);
      }
    }
    currState = nullptr;

    if constexpr (Direction == AnalysisDirection::Backward) {
      return bb.preds();
    } else {
      return bb.succs();
    }
  }